

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioUtils.c
# Opt level: O3

void Mio_DeriveGateDelays
               (Mio_Gate_t *pGate,float **ptPinDelays,int nPins,int nInputs,float tDelayZero,
               float *ptDelaysRes,float *ptPinDelayMax)

{
  Mio_Pin_t *pMVar1;
  undefined1 auVar2 [16];
  char *pcVar3;
  Mio_Pin_t *pMVar4;
  ulong uVar5;
  long lVar6;
  float fVar7;
  float fVar8;
  int iVar10;
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  int iVar15;
  long lVar12;
  
  auVar2 = _DAT_00912220;
  if (pGate->nInputs != nPins) {
    __assert_fail("pGate->nInputs == nPins",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/mio/mioUtils.c"
                  ,0x425,
                  "void Mio_DeriveGateDelays(Mio_Gate_t *, float **, int, int, float, float *, float *)"
                 );
  }
  fVar7 = 0.0;
  if (0 < nInputs) {
    lVar6 = (ulong)(uint)nInputs - 1;
    auVar9._8_4_ = (int)lVar6;
    auVar9._0_8_ = lVar6;
    auVar9._12_4_ = (int)((ulong)lVar6 >> 0x20);
    lVar6 = 0;
    auVar9 = auVar9 ^ _DAT_00912220;
    auVar11 = _DAT_009134e0;
    auVar13 = _DAT_00912210;
    do {
      auVar14 = auVar13 ^ auVar2;
      iVar10 = auVar9._4_4_;
      if ((bool)(~(auVar14._4_4_ == iVar10 && auVar9._0_4_ < auVar14._0_4_ || iVar10 < auVar14._4_4_
                  ) & 1)) {
        *(float *)((long)ptDelaysRes + lVar6) = tDelayZero;
      }
      if ((auVar14._12_4_ != auVar9._12_4_ || auVar14._8_4_ <= auVar9._8_4_) &&
          auVar14._12_4_ <= auVar9._12_4_) {
        *(float *)((long)ptDelaysRes + lVar6 + 4) = tDelayZero;
      }
      auVar14 = auVar11 ^ auVar2;
      iVar15 = auVar14._4_4_;
      if (iVar15 <= iVar10 && (iVar15 != iVar10 || auVar14._0_4_ <= auVar9._0_4_)) {
        *(float *)((long)ptDelaysRes + lVar6 + 8) = tDelayZero;
        *(float *)((long)ptDelaysRes + lVar6 + 0xc) = tDelayZero;
      }
      lVar12 = auVar13._8_8_;
      auVar13._0_8_ = auVar13._0_8_ + 4;
      auVar13._8_8_ = lVar12 + 4;
      lVar12 = auVar11._8_8_;
      auVar11._0_8_ = auVar11._0_8_ + 4;
      auVar11._8_8_ = lVar12 + 4;
      lVar6 = lVar6 + 0x10;
    } while ((ulong)(nInputs + 3U >> 2) << 4 != lVar6);
    if (0 < nInputs) {
      pMVar1 = pGate->pPins;
      uVar5 = 0;
      fVar8 = 0.0;
      do {
        lVar6 = 0;
        if (pMVar1 != (Mio_Pin_t *)0x0) {
          lVar6 = 0;
          pMVar4 = pMVar1;
          do {
            if ((0.0 <= ptPinDelays[lVar6][uVar5]) &&
               (fVar7 = ptPinDelays[lVar6][uVar5] + (float)pMVar4->dDelayBlockMax,
               ptDelaysRes[uVar5] <= fVar7 && fVar7 != ptDelaysRes[uVar5])) {
              ptDelaysRes[uVar5] = fVar7;
            }
            lVar6 = lVar6 + 1;
            pMVar4 = pMVar4->pNext;
          } while (pMVar4 != (Mio_Pin_t *)0x0);
        }
        if ((int)lVar6 != nPins) {
          pcVar3 = Mio_GateReadName(pGate);
          printf("DEBUG: problem gate is %s\n",pcVar3);
          __assert_fail("k == nPins",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/mio/mioUtils.c"
                        ,0x439,
                        "void Mio_DeriveGateDelays(Mio_Gate_t *, float **, int, int, float, float *, float *)"
                       );
        }
        fVar7 = ptDelaysRes[uVar5];
        if (ptDelaysRes[uVar5] <= fVar8) {
          fVar7 = fVar8;
        }
        uVar5 = uVar5 + 1;
        fVar8 = fVar7;
      } while (uVar5 != (uint)nInputs);
    }
  }
  *ptPinDelayMax = fVar7;
  return;
}

Assistant:

void Mio_DeriveGateDelays( Mio_Gate_t * pGate, 
    float ** ptPinDelays, int nPins, int nInputs, float tDelayZero, 
    float * ptDelaysRes, float * ptPinDelayMax )
{
    Mio_Pin_t * pPin;
    float Delay, DelayMax;
    int i, k;
    assert( pGate->nInputs == nPins );
    // set all the delays to the unused delay
    for ( i = 0; i < nInputs; i++ )
        ptDelaysRes[i] = tDelayZero;
    // compute the delays for each input and the max delay at the same time
    DelayMax = 0;
    for ( i = 0; i < nInputs; i++ )
    {
        for ( k = 0, pPin = pGate->pPins; pPin; pPin = pPin->pNext, k++ )
        {
            if ( ptPinDelays[k][i] < 0 )
                continue;
            Delay = ptPinDelays[k][i] + (float)pPin->dDelayBlockMax;
            if ( ptDelaysRes[i] < Delay )
                ptDelaysRes[i] = Delay;
        }
        if ( k != nPins )
        {
            printf ("DEBUG: problem gate is %s\n", Mio_GateReadName( pGate ));
        }
        assert( k == nPins );
        if ( DelayMax < ptDelaysRes[i] )
            DelayMax = ptDelaysRes[i];
    }
    *ptPinDelayMax = DelayMax;
}